

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_type_&,_const_convert_b_&> * __thiscall
Catch::ExprLhs<C_A_T_C_H_T_E_S_T_0()::type_const&>::operator==
          (BinaryExpr<const_type_&,_const_convert_b_&> *__return_storage_ptr__,
          ExprLhs<C_A_T_C_H_T_E_S_T_0()::type_const&> *this,convert_b *rhs)

{
  type *lhs;
  bool comparisonResult;
  StringRef local_30;
  convert_b *local_20;
  convert_b *rhs_local;
  ExprLhs<const_type_&> *this_local;
  
  local_20 = rhs;
  rhs_local = (convert_b *)this;
  this_local = (ExprLhs<const_type_&> *)__return_storage_ptr__;
  comparisonResult =
       compareEqual<C_A_T_C_H_T_E_S_T_0()::type,C_A_T_C_H_T_E_S_T_0()::convert_b>
                 (*(type **)this,rhs);
  lhs = *(type **)this;
  StringRef::StringRef(&local_30,"==");
  BinaryExpr<const_type_&,_const_convert_b_&>::BinaryExpr
            (__return_storage_ptr__,comparisonResult,lhs,local_30,local_20);
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }